

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O2

int __thiscall PGSStreamReader::readObjectDef(PGSStreamReader *this,uint8_t *pos,uint8_t *end)

{
  ulong uVar1;
  ulong uVar2;
  ushort uVar5;
  pointer puVar6;
  pointer puVar7;
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  uint16_t uVar17;
  uint32_t uVar18;
  mapped_type_conflict1 *pmVar19;
  ostream *poVar20;
  undefined4 *puVar21;
  int iVar22;
  uint8_t *__src;
  uint16_t object_id;
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8;
  undefined7 uStack_1c7;
  undefined8 uStack_1c0;
  BitmapInfo local_1b8;
  ostringstream ss;
  undefined1 uVar3;
  undefined3 uVar4;
  
  uVar18 = AV_RB24(pos + 4);
  if ((this->super_AbstractStreamReader).m_bufEnd < pos + (ulong)uVar18 + 7) {
    iVar22 = 1;
  }
  else {
    puVar6 = (this->m_dstRle).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_dstRle).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar6) {
      (this->m_dstRle).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar6;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (&this->m_dstRle,(ulong)uVar18);
    uVar17 = AV_RB16(pos + 7);
    this->object_width = uVar17;
    uVar17 = AV_RB16(pos + 9);
    this->object_height = uVar17;
    object_id = 0;
    __src = pos + 0xb;
    while (__src < pos + (ulong)uVar18 + 7) {
      if (end <= __src) {
        if (*__src != '\x15') {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
          poVar20 = std::operator<<((ostream *)&ss,"Unexpected byte ");
          poVar20 = std::operator<<(poVar20,*__src);
          std::operator<<(poVar20," during parsing Object definition segment");
          puVar21 = (undefined4 *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          *puVar21 = 3;
          *(undefined4 **)(puVar21 + 2) = puVar21 + 6;
          if (local_1d8 == &local_1c8) {
            *(ulong *)(puVar21 + 6) = CONCAT71(uStack_1c7,local_1c8);
            *(undefined8 *)(puVar21 + 8) = uStack_1c0;
          }
          else {
            *(undefined1 **)(puVar21 + 2) = local_1d8;
            *(ulong *)(puVar21 + 6) = CONCAT71(uStack_1c7,local_1c8);
          }
          *(undefined8 *)(puVar21 + 4) = local_1d0;
          local_1d0 = 0;
          local_1c8 = 0;
          local_1d8 = &local_1c8;
          __cxa_throw(puVar21,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
        }
        uVar17 = AV_RB16(__src + 1);
        end = __src + (ulong)uVar17 + 1;
        object_id = AV_RB16(__src + 3);
        __src = __src + 7;
      }
      puVar6 = (this->m_dstRle).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      puVar7 = (this->m_dstRle).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->m_dstRle,(size_type)(end + (long)(puVar6 + (-(long)__src - (long)puVar7))));
      memcpy(puVar6 + ((long)(this->m_dstRle).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start - (long)puVar7),__src,
             (long)end - (long)__src);
      __src = end;
    }
    if (this->m_needRescale == true) {
      pmVar19 = std::
                map<unsigned_short,_unsigned_short,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
                ::operator[](&this->composition_object_horizontal_position,&object_id);
      uVar5 = *pmVar19;
      pmVar19 = std::
                map<unsigned_short,_unsigned_short,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>_>
                ::operator[](&this->composition_object_vertical_position,&object_id);
      decodeRleData(this,(uint)uVar5,(uint)*pmVar19);
      iVar22 = 0x21;
      if (this->m_fontBorder == 0) {
        iVar22 = 0;
      }
      yuvToRgb(this,iVar22);
      local_1b8.buffer = (RGBQUAD *)this->m_rgbBuffer;
      uVar1._0_2_ = this->m_video_width;
      uVar1._2_2_ = this->m_video_height;
      uVar1._4_4_ = *(undefined4 *)&this->field_0xbc;
      auVar9._8_4_ = 0;
      auVar9._0_8_ = uVar1;
      auVar9._12_2_ = (short)((uint)uVar1._4_4_ >> 0x10);
      auVar11._8_2_ = (short)uVar1._4_4_;
      auVar11._0_8_ = uVar1;
      auVar11._10_4_ = auVar9._10_4_;
      auVar15._6_8_ = 0;
      auVar15._0_6_ = auVar11._8_6_;
      auVar14._6_8_ = SUB148(auVar15 << 0x40,6);
      auVar14._4_2_ = uVar1._2_2_;
      auVar14._2_2_ = 0;
      auVar14._0_2_ = (undefined2)uVar1;
      local_1b8._0_8_ = auVar14._0_8_;
      uVar2._0_2_ = this->m_scaled_width;
      uVar2._2_2_ = this->m_scaled_height;
      uVar3 = this->m_firstRenderedPacket;
      uVar4 = *(undefined3 *)&this->field_0x145;
      uVar2._4_4_ = CONCAT31(uVar4,uVar3);
      auVar8._8_4_ = 0;
      auVar8._0_8_ = uVar2;
      auVar8._12_2_ = (short)((uint3)uVar4 >> 8);
      auVar10._8_2_ = (short)uVar2._4_4_;
      auVar10._0_8_ = uVar2;
      auVar10._10_4_ = auVar8._10_4_;
      auVar16._6_8_ = 0;
      auVar16._0_6_ = auVar10._8_6_;
      auVar12._4_2_ = uVar2._2_2_;
      auVar12._0_4_ = (uint)uVar2;
      auVar12._6_8_ = SUB148(auVar16 << 0x40,6);
      auVar13._4_10_ = auVar12._4_10_;
      auVar13._0_4_ = (uint)uVar2 & 0xffff;
      _ss = auVar13._0_8_;
      rescaleRGB((BitmapInfo *)&ss,&local_1b8);
      if (this->m_fontBorder != 0) {
        text_subtitles::TextSubtitlesRender::addBorder
                  (this->m_fontBorder,this->m_scaledRgbBuffer,(uint)this->m_scaled_width,
                   (uint)this->m_scaled_height);
      }
    }
    iVar22 = 0;
  }
  return iVar22;
}

Assistant:

int PGSStreamReader::readObjectDef(const uint8_t* pos, const uint8_t* end)
{
    pos += 4;  // skip object ID and version number
    const uint32_t objectSize = AV_RB24(pos);
    pos += 3;
    const uint8_t* objEnd = pos + objectSize;

    if (m_bufEnd < objEnd)
        return NEED_MORE_DATA;

    m_dstRle.clear();
    m_dstRle.reserve(objectSize);

    object_width = AV_RB16(pos);
    pos += 2;
    object_height = AV_RB16(pos);
    pos += 2;
    uint16_t object_id = 0;
    while (pos < objEnd)
    {
        if (pos >= end)
        {
            if (*pos != OBJECT_DEF_SEGMENT)
                THROW(ERR_COMMON, "Unexpected byte " << *pos << " during parsing Object definition segment")
            pos++;  // skip OBJECT_DEF_SEGMENT
            end = pos + AV_RB16(pos);
            pos += 2;
            object_id = AV_RB16(pos);
            pos += 4;  // skip object ID and version number
        }
        const size_t oldSize = m_dstRle.size();
        m_dstRle.resize(oldSize + end - pos);
        memcpy(&m_dstRle[oldSize], pos, end - pos);
        pos += end - pos;
    }
    if (m_needRescale)
    {
        decodeRleData(composition_object_horizontal_position[object_id],
                      composition_object_vertical_position[object_id]);
        yuvToRgb(m_fontBorder ? Y_THRESHOLD : 0);
        BitmapInfo bmpDest;
        BitmapInfo bmpRef;

        bmpRef.buffer = reinterpret_cast<RGBQUAD*>(m_rgbBuffer);
        bmpRef.Width = m_video_width;
        bmpRef.Height = m_video_height;
        bmpDest.buffer = reinterpret_cast<RGBQUAD*>(m_scaledRgbBuffer);
        bmpDest.Width = m_scaled_width;
        bmpDest.Height = m_scaled_height;

        rescaleRGB(&bmpDest, &bmpRef);
        if (m_fontBorder)
            TextSubtitlesRender::addBorder(m_fontBorder, m_scaledRgbBuffer, m_scaled_width, m_scaled_height);
        // memcpy(bmpDest.buffer, bmpRef.buffer, bmpDest.Width * bmpDest.Height * 4);
    }
    return 0;
}